

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O1

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  ulong uVar1;
  pointer pVVar2;
  pointer pdVar3;
  long lVar4;
  pointer pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  this->factorised = false;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&(this->lu_factorised).
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  pVVar2 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->lu_factorised).
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  bVar14 = lVar8 == 0;
  if (!bVar14) {
    uVar7 = (lVar8 >> 3) * -0x5555555555555555;
    pdVar9 = *(double **)
              &(pVVar2->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>;
    if (this->factorisation_tolerance <= ABS(*pdVar9)) {
      pdVar10 = pdVar9;
      uVar11 = 0;
      do {
        uVar1 = uVar11 + 1;
        if (uVar1 < uVar7) {
          pdVar3 = *(pointer *)
                    ((long)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_> + 8);
          lVar8 = *(long *)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>;
          uVar12 = uVar1;
          do {
            lVar4 = *(long *)&pVVar2[uVar12].super_vector<double,_std::allocator<double>_>;
            *(double *)(lVar4 + uVar11 * 8) = *(double *)(lVar4 + uVar11 * 8) / *pdVar9;
            if (uVar1 < (ulong)((long)pdVar3 - lVar8 >> 3)) {
              pdVar5 = *(pointer *)
                        ((long)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                                super__Vector_base<double,_std::allocator<double>_> + 8);
              lVar6 = *(long *)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                                super__Vector_base<double,_std::allocator<double>_>;
              uVar13 = uVar1;
              do {
                *(double *)(lVar4 + uVar13 * 8) =
                     *(double *)(lVar4 + uVar13 * 8) -
                     *(double *)(lVar4 + uVar11 * 8) * pdVar10[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar13 < (ulong)((long)pdVar5 - lVar6 >> 3));
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar7);
        }
        if (uVar1 == uVar7 + (uVar7 == 0)) {
          bVar14 = uVar7 <= uVar1;
          goto LAB_0010d1d5;
        }
        pdVar10 = *(double **)&pVVar2[uVar1].super_vector<double,_std::allocator<double>_>;
        pdVar9 = pdVar10 + uVar1;
        uVar11 = uVar1;
      } while (this->factorisation_tolerance <= ABS(*pdVar9));
      bVar14 = uVar7 <= uVar1;
    }
    if (bVar14 == false) {
      return false;
    }
  }
LAB_0010d1d5:
  this->factorised = true;
  return bVar14;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}